

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_queue.cpp
# Opt level: O1

uint32_t __thiscall cppnet::BufferQueue::ReadNotMovePt(BufferQueue *this,char *res,uint32_t len)

{
  element_type *peVar1;
  int iVar2;
  uint32_t uVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  
  uVar3 = 0;
  if ((res != (char *)0x0) && (uVar3 = 0, (this->_buffer_list)._size != 0)) {
    peVar4 = (this->_buffer_list)._head.
             super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    this_00 = (this->_buffer_list)._head.
              super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
    uVar3 = 0;
    if (len != 0 && peVar4 != (element_type *)0x0) {
      uVar3 = 0;
      this_01 = this_00;
      while( true ) {
        iVar2 = (*(peVar4->super_InnerBuffer).super_Buffer._vptr_Buffer[2])
                          (peVar4,res + uVar3,(ulong)(len - uVar3));
        uVar3 = uVar3 + iVar2;
        this_00 = this_01;
        if (peVar4 == (this->_buffer_write).
                      super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
        break;
        peVar1 = (peVar4->super_ListSlot<cppnet::BufferBlock>)._next.
                 super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        this_00 = (peVar4->super_ListSlot<cppnet::BufferBlock>)._next.
                  super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi;
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            this_00->_M_use_count = this_00->_M_use_count + 1;
            UNLOCK();
          }
          else {
            this_00->_M_use_count = this_00->_M_use_count + 1;
          }
        }
        if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
        }
        if ((peVar1 == (element_type *)0x0) || (peVar4 = peVar1, this_01 = this_00, len <= uVar3))
        break;
      }
    }
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
  }
  return uVar3;
}

Assistant:

uint32_t BufferQueue::ReadNotMovePt(char* res, uint32_t len) {
    if (_buffer_list.Size() == 0 || !res) {
        return 0;
    }

    std::shared_ptr<BufferBlock> temp = _buffer_list.GetHead();
    uint32_t read_len = 0;
    while (temp && read_len < len) {
        read_len += temp->ReadNotMovePt(res + read_len, len - read_len);
        if (temp == _buffer_write) {
            break;
        }
        temp = temp->GetNext();
    }
    return read_len;
}